

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int ConnectSSC32x(SSC32 *pSSC32,char *szCfgFilePath)

{
  int iVar1;
  int local_24;
  int res;
  int id;
  char *szCfgFilePath_local;
  SSC32 *pSSC32_local;
  
  local_24 = 0;
  do {
    if (addrsSSC32[local_24] == (void *)0x0) {
      iVar1 = ConnectSSC32(pSSC32,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsSSC32[local_24] = pSSC32;
      return 0;
    }
    local_24 = local_24 + 1;
  } while (local_24 < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int ConnectSSC32x(SSC32* pSSC32, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsSSC32[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = ConnectSSC32(pSSC32, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

	addrsSSC32[id] = pSSC32;

	return EXIT_SUCCESS;
}